

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O3

void __thiscall settings_tests::ReadWrite::test_method(ReadWrite *this)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *left_end;
  shared_count **ppsVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  readonly_property<bool> rVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  allocator_type *__a;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long lVar10;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  const_string file_09;
  const_string file_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  check_type cVar11;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  allocator_type local_5d1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fail_parse;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  non_kv;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dup_keys;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  assertion_result local_330;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  values;
  vector<UniValue,_std::allocator<UniValue>_> vStack_2d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  expected;
  undefined1 local_288 [40];
  path path;
  undefined1 local_238 [8];
  filebuf local_230 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [6];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1c0;
  undefined1 local_148 [120];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_d0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)local_288,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append((path *)local_288,0xd,"settings.json");
  std::filesystem::__cxx11::path::path(&path.super_path,(path *)local_288);
  std::filesystem::__cxx11::path::~path((path *)local_288);
  pp_Var1 = &values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  values._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&values,
             "{\n        \"string\": \"string\",\n        \"num\": 5,\n        \"bool\": true,\n        \"null\": null\n    }"
             ,"");
  std::ofstream::ofstream(local_238);
  std::ofstream::open(local_238,(_Ios_Openmode)path.super_path._M_pathname._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,(char *)values._M_t._M_impl._0_8_,
             values._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  uVar4 = _vtable;
  pp_Var3 = _VTT;
  local_238 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_238 + (long)_VTT[-3]) = _vtable;
  std::filebuf::~filebuf(local_230);
  std::ios_base::~ios_base((ios_base *)(local_148 + 8));
  if ((_Base_ptr *)values._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)values._M_t._M_impl._0_8_,
                    (ulong)((long)&(values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::pair<const_char_(&)[7],_const_char_(&)[7],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_238,(char (*) [7])0x10db587,(char (*) [7])0x10db587);
  local_330._0_4_ = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::pair<const_char_(&)[4],_int,_true>(&local_1c0,(char (*) [4])0xf7e6e4,(int *)&local_330);
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(errors.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::pair<const_char_(&)[5],_bool,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_148,(char (*) [5])0xe74842,(bool *)&errors);
  pp_Var1 = &values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       ((ulong)values._M_t._M_impl.super__Rb_tree_header._M_header._M_left & 0xffffffffffffff00);
  values._M_t._M_impl._0_8_ = values._M_t._M_impl._0_8_ & 0xffffffff00000000;
  values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vStack_2d0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_2d0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vStack_2d0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  values._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pp_Var1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::pair<const_char_(&)[5],_true>(&local_d0,(char (*) [5])0xe9daa7,(UniValue *)&values);
  __a = (allocator_type *)&non_kv;
  __l._M_len = 4;
  __l._M_array = (iterator)local_238;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::map(&expected,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &dup_keys,__a);
  lVar10 = 0x1e0;
  do {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)
               ((long)&path.super_path._M_pathname.field_2 + lVar10));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar10 + 0x20));
    if ((long *)(local_288 + lVar10 + 0x10) != *(long **)(local_288 + lVar10)) {
      operator_delete(*(long **)(local_288 + lVar10),*(long *)(local_288 + lVar10 + 0x10) + 1);
    }
    if ((long *)(local_288 + lVar10 + -0x18) != *(long **)(local_288 + lVar10 + -0x28)) {
      operator_delete(*(long **)(local_288 + lVar10 + -0x28),
                      *(long *)(local_288 + lVar10 + -0x18) + 1);
    }
    lVar10 = lVar10 + -0x78;
  } while (lVar10 != 0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&values._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((_Base_ptr *)values._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != pp_Var1) {
    operator_delete((void *)values._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                    (ulong)((long)&(values._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                                   _M_color + 1));
  }
  left_end = &values._M_t._M_impl.super__Rb_tree_header;
  values._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       values._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4b;
  file.m_begin = (iterator)&local_358;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)__a;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &left_end->_M_header;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &left_end->_M_header;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_368,msg);
  _cVar11 = 0x626643;
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)common::ReadSettings(&path,&values,&errors);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xee8315;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xee833f;
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_370 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_228[0]._8_8_ =
       (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       &dup_keys;
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0,WARN,_cVar11,(size_t)&local_378,0x4b);
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4c;
  file_00.m_begin = (iterator)&local_388;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_398,
             msg_00);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_330,(equal_coll_impl *)&dup_keys,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
              )values._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
              )left_end,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
              )expected._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
              )&expected._M_t._M_impl.super__Rb_tree_header);
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_228[0]._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_3a0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0xd,4,0xee82a1,(size_t)&local_3a8,0x4c,
             "values.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x6267f4;
  file_01.m_end = (iterator)0x4d;
  file_01.m_begin = (iterator)&local_3b8;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3c8,
             msg_01);
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (errors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
       errors.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_173012c;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xee82cb;
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_3d0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_228[0]._8_8_ = &dup_keys;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0,WARN,_cVar11,(size_t)&local_3d8,0x4d);
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  std::filesystem::remove((path *)&path);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x51;
  file_02.m_begin = (iterator)&local_3e8;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3f8,
             msg_02);
  _cVar11 = 0x6268f5;
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)common::ReadSettings(&path,&values,&errors);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xee8315;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xee833f;
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_400 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_228[0]._8_8_ = &dup_keys;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0,WARN,_cVar11,(size_t)&local_408,0x51);
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x6269b3;
  file_03.m_end = (iterator)0x52;
  file_03.m_begin = (iterator)&local_418;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_428,
             msg_03);
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(values._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1730137;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xee82da;
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_430 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_228[0]._8_8_ = &dup_keys;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0,WARN,_cVar11,(size_t)&local_438,0x52);
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x626a7b;
  file_04.m_end = (iterator)0x53;
  file_04.m_begin = (iterator)&local_448;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_458,
             msg_04);
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (errors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
       errors.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_173012c;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xee82cb;
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_460 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_228[0]._8_8_ = &dup_keys;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0,WARN,_cVar11,(size_t)&local_468,0x53);
  ppsVar2 = (shared_count **)&local_330.m_message.pn;
  boost::detail::shared_count::~shared_count((shared_count *)ppsVar2);
  local_330._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_330,
             "{\n        \"dupe\": \"string\",\n        \"dupe\": \"dupe\"\n    }","");
  std::ofstream::ofstream(local_238);
  std::ofstream::open(local_238,(_Ios_Openmode)path.super_path._M_pathname._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,(char *)local_330._0_8_,(long)local_330.m_message.px);
  local_238 = (undefined1  [8])pp_Var3;
  *(undefined8 *)(local_238 + (long)pp_Var3[-3]) = uVar4;
  std::filebuf::~filebuf(local_230);
  std::ios_base::~ios_base((ios_base *)(local_148 + 8));
  if ((shared_count **)local_330._0_8_ != ppsVar2) {
    operator_delete((void *)local_330._0_8_,
                    (ulong)((long)&(local_330.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5a;
  file_05.m_begin = (iterator)&local_478;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_488,
             msg_05);
  _cVar11 = 0x626c11;
  bVar6 = common::ReadSettings(&path,&values,&errors);
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar6;
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_173015b;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xee833f;
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_490 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a;
  local_228[0]._8_8_ = &dup_keys;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0,WARN,_cVar11,(size_t)&local_498,0x5a);
  ppsVar2 = (shared_count **)&local_330.m_message.pn;
  boost::detail::shared_count::~shared_count((shared_count *)ppsVar2);
  local_330._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_330,path.super_path._M_pathname._M_dataplus._M_p,
             path.super_path._M_pathname._M_dataplus._M_p +
             path.super_path._M_pathname._M_string_length);
  tinyformat::format<std::__cxx11::string>
            ((string *)local_238,(tinyformat *)"Found duplicate key dupe in settings file %s",
             (char *)&local_330,pbVar7);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_238;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&dup_keys,__l_00,(allocator_type *)&non_kv);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,(ulong)(local_228[0]._M_allocated_capacity + 1));
  }
  if ((shared_count **)local_330._0_8_ != ppsVar2) {
    operator_delete((void *)local_330._0_8_,
                    (ulong)((long)&(local_330.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x5c;
  file_06.m_begin = (iterator)&local_4c0;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4d0,
             msg_06);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_330,(equal_coll_impl *)&non_kv,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )dup_keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )dup_keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_228[0]._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_4d8 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0xd,4,0xee836d,(size_t)&local_4e0,0x5c,
             "errors.end()","dup_keys.begin()","dup_keys.end()");
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x626e6d;
  file_07.m_end = (iterator)0x5d;
  file_07.m_begin = (iterator)&local_4f0;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_500,
             msg_07);
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(values._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  non_kv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1730137;
  non_kv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xee82da;
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_508 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_228[0]._8_8_ = &non_kv;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0,WARN,_cVar11,(size_t)&local_510,0x5d);
  ppsVar2 = (shared_count **)&local_330.m_message.pn;
  boost::detail::shared_count::~shared_count((shared_count *)ppsVar2);
  local_330._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"\"non-kv\"","");
  std::ofstream::ofstream(local_238);
  std::ofstream::open(local_238,(_Ios_Openmode)path.super_path._M_pathname._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,(char *)local_330._0_8_,(long)local_330.m_message.px);
  local_238 = (undefined1  [8])pp_Var3;
  *(undefined8 *)(local_238 + (long)pp_Var3[-3]) = uVar4;
  std::filebuf::~filebuf(local_230);
  std::ios_base::~ios_base((ios_base *)(local_148 + 8));
  if ((shared_count **)local_330._0_8_ != ppsVar2) {
    operator_delete((void *)local_330._0_8_,
                    (ulong)((long)&(local_330.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x61;
  file_08.m_begin = (iterator)&local_520;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_530,
             msg_08);
  _cVar11 = 0x62700e;
  bVar6 = common::ReadSettings(&path,&values,&errors);
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar6;
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  non_kv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_173015b;
  non_kv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xee833f;
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_538 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x61;
  local_228[0]._8_8_ = &non_kv;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0,WARN,_cVar11,(size_t)&local_540,0x61);
  ppsVar2 = (shared_count **)&local_330.m_message.pn;
  boost::detail::shared_count::~shared_count((shared_count *)ppsVar2);
  local_330._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_330,path.super_path._M_pathname._M_dataplus._M_p,
             path.super_path._M_pathname._M_dataplus._M_p +
             path.super_path._M_pathname._M_string_length);
  tinyformat::format<std::__cxx11::string>
            ((string *)local_238,
             (tinyformat *)"Found non-object value \"non-kv\" in settings file %s",
             (char *)&local_330,pbVar7);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_238;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&non_kv,__l_01,(allocator_type *)&fail_parse);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,(ulong)(local_228[0]._M_allocated_capacity + 1));
  }
  if ((shared_count **)local_330._0_8_ != ppsVar2) {
    operator_delete((void *)local_330._0_8_,
                    (ulong)((long)&(local_330.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x63;
  file_09.m_begin = (iterator)&local_568;
  msg_09.m_end = pvVar9;
  msg_09.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_578,
             msg_09);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_330,(equal_coll_impl *)&fail_parse,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )non_kv.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )non_kv.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_228[0]._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_580 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0xd,4,0xee836d,(size_t)&local_588,99,
             "errors.end()","non_kv.begin()","non_kv.end()");
  ppsVar2 = (shared_count **)&local_330.m_message.pn;
  boost::detail::shared_count::~shared_count((shared_count *)ppsVar2);
  local_330._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"invalid json","");
  std::ofstream::ofstream(local_238);
  std::ofstream::open(local_238,(_Ios_Openmode)path.super_path._M_pathname._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,(char *)local_330._0_8_,(long)local_330.m_message.px);
  local_238 = (undefined1  [8])pp_Var3;
  *(undefined8 *)(local_238 + (long)pp_Var3[-3]) = uVar4;
  std::filebuf::~filebuf(local_230);
  std::ios_base::~ios_base((ios_base *)(local_148 + 8));
  if ((shared_count **)local_330._0_8_ != ppsVar2) {
    operator_delete((void *)local_330._0_8_,
                    (ulong)((long)&(local_330.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x67;
  file_10.m_begin = (iterator)&local_598;
  msg_10.m_end = pvVar9;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_5a8,
             msg_10);
  _cVar11 = 0x627337;
  bVar6 = common::ReadSettings(&path,&values,&errors);
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar6;
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  fail_parse.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_173015b;
  fail_parse.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xee833f;
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_5b0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x67;
  local_228[0]._8_8_ = (equal_coll_impl *)&fail_parse;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0,WARN,_cVar11,(size_t)&local_5b8,0x67);
  ppsVar2 = (shared_count **)&local_330.m_message.pn;
  boost::detail::shared_count::~shared_count((shared_count *)ppsVar2);
  local_330._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_330,path.super_path._M_pathname._M_dataplus._M_p,
             path.super_path._M_pathname._M_dataplus._M_p +
             path.super_path._M_pathname._M_string_length);
  tinyformat::format<std::__cxx11::string>
            ((string *)local_238,
             (tinyformat *)
             "Settings file %s does not contain valid JSON. This is probably caused by disk corruption or a crash, and can be fixed by removing the file, which will reset settings to default values."
             ,(char *)&local_330,pbVar7);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_238;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&fail_parse,__l_02,&local_5d1);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,(ulong)(local_228[0]._M_allocated_capacity + 1));
  }
  if ((shared_count **)local_330._0_8_ != ppsVar2) {
    operator_delete((void *)local_330._0_8_,
                    (ulong)((long)&(local_330.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x6b;
  file_11.m_begin = (iterator)&local_5e8;
  msg_11.m_end = pvVar9;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_5f8,
             msg_11);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_330,(equal_coll_impl *)&local_5d1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )fail_parse.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )fail_parse.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_230[0] = (filebuf)0x0;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  local_228[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_228[0]._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_600 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_238,1,0xd,4,0xee836d,(size_t)&local_608,0x6b,
             "errors.end()","fail_parse.begin()","fail_parse.end()");
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&fail_parse);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&non_kv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dup_keys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&errors);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~_Rb_tree(&values._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~_Rb_tree(&expected._M_t);
  std::filesystem::__cxx11::path::~path(&path.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ReadWrite)
{
    fs::path path = m_args.GetDataDirBase() / "settings.json";

    WriteText(path, R"({
        "string": "string",
        "num": 5,
        "bool": true,
        "null": null
    })");

    std::map<std::string, common::SettingsValue> expected{
        {"string", "string"},
        {"num", 5},
        {"bool", true},
        {"null", {}},
    };

    // Check file read.
    std::map<std::string, common::SettingsValue> values;
    std::vector<std::string> errors;
    BOOST_CHECK(common::ReadSettings(path, values, errors));
    BOOST_CHECK_EQUAL_COLLECTIONS(values.begin(), values.end(), expected.begin(), expected.end());
    BOOST_CHECK(errors.empty());

    // Check no errors if file doesn't exist.
    fs::remove(path);
    BOOST_CHECK(common::ReadSettings(path, values, errors));
    BOOST_CHECK(values.empty());
    BOOST_CHECK(errors.empty());

    // Check duplicate keys not allowed and that values returns empty if a duplicate is found.
    WriteText(path, R"({
        "dupe": "string",
        "dupe": "dupe"
    })");
    BOOST_CHECK(!common::ReadSettings(path, values, errors));
    std::vector<std::string> dup_keys = {strprintf("Found duplicate key dupe in settings file %s", fs::PathToString(path))};
    BOOST_CHECK_EQUAL_COLLECTIONS(errors.begin(), errors.end(), dup_keys.begin(), dup_keys.end());
    BOOST_CHECK(values.empty());

    // Check non-kv json files not allowed
    WriteText(path, R"("non-kv")");
    BOOST_CHECK(!common::ReadSettings(path, values, errors));
    std::vector<std::string> non_kv = {strprintf("Found non-object value \"non-kv\" in settings file %s", fs::PathToString(path))};
    BOOST_CHECK_EQUAL_COLLECTIONS(errors.begin(), errors.end(), non_kv.begin(), non_kv.end());

    // Check invalid json not allowed
    WriteText(path, R"(invalid json)");
    BOOST_CHECK(!common::ReadSettings(path, values, errors));
    std::vector<std::string> fail_parse = {strprintf("Settings file %s does not contain valid JSON. This is probably caused by disk corruption or a crash, "
                                                     "and can be fixed by removing the file, which will reset settings to default values.",
                                                     fs::PathToString(path))};
    BOOST_CHECK_EQUAL_COLLECTIONS(errors.begin(), errors.end(), fail_parse.begin(), fail_parse.end());
}